

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

void __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::DecommitNow(PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
              *this,bool all)

{
  RealCount *pRVar1;
  uint uVar2;
  PageMemoryData *pPVar3;
  HANDLE pVVar4;
  DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *pDVar5;
  code *pcVar6;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *pDVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  DWORD DVar11;
  uint uVar12;
  undefined4 *puVar13;
  FreePageEntry *__s;
  ThreadContextId pvVar14;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *pDVar15;
  HANDLE pVVar16;
  size_t *psVar17;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *pPVar18;
  size_t sVar19;
  char16_t *form;
  char cVar20;
  ulong bytes;
  CriticalSection *this_00;
  ulong uVar21;
  undefined1 local_68 [8];
  EditingIterator i;
  long local_50;
  ulong local_40;
  
  iVar10 = (*this->_vptr_PageAllocatorBase[3])();
  if ((char)iVar10 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x797,"(!this->HasMultiThreadAccess())","!this->HasMultiThreadAccess()");
    if (!bVar8) goto LAB_00709683;
    *puVar13 = 0;
  }
  if ((DAT_015d6420 == '\x01') && (bVar8 = HasZeroPageQueue(this), bVar8)) {
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    bVar8 = false;
    i.super_Iterator.current = (NodeBase *)0x0;
    do {
      __s = PopPendingZeroPage(this);
      if (__s == (FreePageEntry *)0x0) {
        bVar9 = true;
        bVar8 = true;
      }
      else {
        bVar9 = true;
        if (this->waitingToEnterIdleDecommit == false) {
          bVar9 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
          if (bVar9) {
            pvVar14 = JsUtil::ExternalApi::GetCurrentThreadContextId();
            DVar11 = GetCurrentThreadId();
            Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar14,(ulong)DVar11,this);
            if (this->debugName != (char16 *)0x0) {
              Output::Print(L"[%s] ");
            }
            Output::Print(L"Freeing page from zero queue","");
            Output::Print(L"\n");
            bVar9 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
            if (bVar9) {
              (*this->_vptr_PageAllocatorBase[5])(this);
            }
            Output::Flush();
          }
          pPVar18 = __s->segment;
          uVar2 = __s->pageCount;
          uVar21 = (ulong)uVar2;
          pDVar15 = GetSegmentList(this,pPVar18);
          if (pDVar15 ==
              (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
               *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar13 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                               ,0x7cb,"(fromSegmentList != nullptr)","fromSegmentList != nullptr");
            if (!bVar9) goto LAB_00709683;
            *puVar13 = 0;
          }
          if (all) {
            PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::DecommitPages<false>
                      (pPVar18,__s,uVar2);
            bytes = uVar21 * 0x1000;
            SubUsedBytes(this,bytes);
            pPVar3 = this->memoryData;
            psVar17 = &this->committedBytes;
            if (pPVar3 != (PageMemoryData *)0x0) {
              pPVar3->releasePageCount = pPVar3->releasePageCount + uVar21;
              this->committedBytes = this->committedBytes + uVar21 * -0x1000;
              pPVar3->decommitPageCount = pPVar3->decommitPageCount + uVar21;
              psVar17 = &pPVar3->currentCommittedPageCount;
              bytes = uVar21;
            }
            *psVar17 = *psVar17 - bytes;
            uVar12 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetAvailablePageCount
                               (pPVar18);
            if (uVar12 != pPVar18->decommitPageCount) goto LAB_007089fc;
            LogFreePartiallyDecommittedPageSegment(this,pPVar18);
            DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
            RemoveElement<Memory::NoThrowHeapAllocator>
                      (pDVar15,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance,pPVar18);
            i.super_Iterator.current =
                 (NodeBase *)
                 ((long)&(i.super_Iterator.current)->next + (ulong)this->maxAllocPageCount);
          }
          else {
            pVVar4 = this->processHandle;
            pVVar16 = GetCurrentProcess();
            if (pVVar4 != pVVar16) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar13 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                                 ,0x7e3,"(this->processHandle == GetCurrentProcess())",
                                 "this->processHandle == GetCurrentProcess()");
              if (!bVar9) goto LAB_00709683;
              *puVar13 = 0;
            }
            memset(__s,0,(ulong)(uVar2 << 0xc));
            PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::ReleasePages(pPVar18,__s,uVar2)
            ;
            SubUsedBytes(this,uVar21 << 0xc);
            if (this->memoryData != (PageMemoryData *)0x0) {
              psVar17 = &this->memoryData->releasePageCount;
              *psVar17 = *psVar17 + uVar21;
            }
LAB_007089fc:
            TransferSegment(this,pPVar18,pDVar15);
          }
          bVar9 = false;
        }
      }
    } while (!bVar9);
    if (bVar8) {
      this_00 = &this->backgroundPageQueue->backgroundPageQueueCriticalSection;
      CCLock::Enter(&this_00->super_CCLock);
      this->hasZeroQueuedPages = false;
      bVar8 = HasZeroQueuedPages(this);
      if (bVar8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x7f2,"(!this->HasZeroQueuedPages())","!this->HasZeroQueuedPages()");
        if (!bVar8) goto LAB_00709683;
        *puVar13 = 0;
      }
      CCLock::Leave(&this_00->super_CCLock);
    }
    FlushBackgroundPages(this);
  }
  else {
    i.super_Iterator.current = (NodeBase *)0x0;
  }
  if (this->freePageCount == 0) {
    if (this->debugMinFreePageCount == 0) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x7fc,"(debugMinFreePageCount == 0)","debugMinFreePageCount == 0");
    if (bVar8) {
      *puVar13 = 0;
      return;
    }
    goto LAB_00709683;
  }
  bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
  if (bVar8) {
    pvVar14 = JsUtil::ExternalApi::GetCurrentThreadContextId();
    DVar11 = GetCurrentThreadId();
    Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar14,(ulong)DVar11,this);
    if (this->debugName != (char16 *)0x0) {
      Output::Print(L"[%s] ");
    }
    Output::Print(L"Decommit now","");
    Output::Print(L"\n");
    bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
    if (bVar8) {
      (*this->_vptr_PageAllocatorBase[5])(this);
    }
    Output::Flush();
  }
  UpdateMinFreePageCount(this);
  if (all) {
    bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
    if (bVar8) {
      pvVar14 = JsUtil::ExternalApi::GetCurrentThreadContextId();
      DVar11 = GetCurrentThreadId();
      Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar14,(ulong)DVar11,this);
      if (this->debugName != (char16 *)0x0) {
        Output::Print(L"[%s] ");
      }
      form = L"Full decommit";
      local_40 = 0;
LAB_00708d42:
      Output::Print(form,"");
      Output::Print(L"\n");
      bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
      if (bVar8) {
        (*this->_vptr_PageAllocatorBase[5])(this);
      }
      Output::Flush();
    }
    else {
      local_40 = 0;
    }
  }
  else {
    if (this->freePageCount < this->minFreePageCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x811,"(this->minFreePageCount <= this->freePageCount)",
                         "this->minFreePageCount <= this->freePageCount");
      if (!bVar8) goto LAB_00709683;
      *puVar13 = 0;
    }
    uVar21 = this->freePageCount - (this->minFreePageCount >> 1);
    local_40 = 0x1000;
    if (0x1000 < uVar21) {
      local_40 = uVar21;
    }
    bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
    if (bVar8) {
      pvVar14 = JsUtil::ExternalApi::GetCurrentThreadContextId();
      DVar11 = GetCurrentThreadId();
      Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar14,(ulong)DVar11,this);
      if (this->debugName != (char16 *)0x0) {
        Output::Print(L"[%s] ");
      }
      form = L"Partial decommit";
      goto LAB_00708d42;
    }
  }
  uVar21 = this->freePageCount - local_40;
  if (this->freePageCount < local_40 || uVar21 == 0) {
    bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
    if (bVar8) {
      pvVar14 = JsUtil::ExternalApi::GetCurrentThreadContextId();
      DVar11 = GetCurrentThreadId();
      Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar14,(ulong)DVar11,this);
      if (this->debugName != (char16 *)0x0) {
        Output::Print(L"[%s] ");
      }
      Output::Print(L"No pages to decommit","");
      Output::Print(L"\n");
      bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
      if (bVar8) {
        (*this->_vptr_PageAllocatorBase[5])(this);
      }
      Output::Flush();
      return;
    }
  }
  else {
    bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
    if (bVar8) {
      pvVar14 = JsUtil::ExternalApi::GetCurrentThreadContextId();
      DVar11 = GetCurrentThreadId();
      Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar14,(ulong)DVar11,this);
      if (this->debugName != (char16 *)0x0) {
        Output::Print(L"[%s] ");
      }
      Output::Print(L"Decommit page count = %d",uVar21);
      Output::Print(L"\n");
      bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
      if (bVar8) {
        (*this->_vptr_PageAllocatorBase[5])(this);
      }
      Output::Flush();
    }
    bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
    if (bVar8) {
      pvVar14 = JsUtil::ExternalApi::GetCurrentThreadContextId();
      DVar11 = GetCurrentThreadId();
      Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar14,(ulong)DVar11,this);
      if (this->debugName != (char16 *)0x0) {
        Output::Print(L"[%s] ");
      }
      Output::Print(L"Free page count = %d",this->freePageCount);
      Output::Print(L"\n");
      bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
      if (bVar8) {
        (*this->_vptr_PageAllocatorBase[5])(this);
      }
      Output::Flush();
    }
    bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
    if (bVar8) {
      pvVar14 = JsUtil::ExternalApi::GetCurrentThreadContextId();
      DVar11 = GetCurrentThreadId();
      Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar14,(ulong)DVar11,this);
      if (this->debugName != (char16 *)0x0) {
        Output::Print(L"[%s] ");
      }
      Output::Print(L"New free page count = %d",local_40);
      Output::Print(L"\n");
      bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
      if (bVar8) {
        (*this->_vptr_PageAllocatorBase[5])(this);
      }
      Output::Flush();
    }
    pDVar15 = &this->decommitSegments;
    local_68 = (undefined1  [8])pDVar15;
    i.super_Iterator.list = pDVar15;
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    local_50 = 0;
    do {
      if (uVar21 == 0) {
        uVar21 = 0;
        pDVar7 = i.super_Iterator.list;
        break;
      }
      if (i.super_Iterator.list ==
          (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
          0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                           ,0x66,"(current != nullptr)","current != nullptr");
        if (!bVar8) goto LAB_00709683;
        *puVar13 = 0;
      }
      i.super_Iterator.list =
           ((i.super_Iterator.list)->
           super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).
           next.list;
      pDVar7 = (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                *)0x0;
      if ((undefined1  [8])i.super_Iterator.list == local_68) break;
      pPVar18 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                ::Iterator::Data((Iterator *)local_68);
      sVar19 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::DecommitFreePages
                         (pPVar18,uVar21);
      this->committedBytes = this->committedBytes + sVar19 * -0x1000;
      pPVar3 = this->memoryData;
      if (pPVar3 != (PageMemoryData *)0x0) {
        pPVar3->decommitPageCount = pPVar3->decommitPageCount + sVar19;
        pPVar3->currentCommittedPageCount = pPVar3->currentCommittedPageCount - sVar19;
      }
      pPVar18 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                ::Iterator::Data((Iterator *)local_68);
      if (pPVar18->decommitPageCount == this->maxAllocPageCount) {
        pPVar18 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                  ::Iterator::Data((Iterator *)local_68);
        LogFreePartiallyDecommittedPageSegment(this,pPVar18);
        DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
        EditingIterator::RemoveCurrent<Memory::NoThrowHeapAllocator>
                  ((EditingIterator *)local_68,
                   (NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance);
        i.super_Iterator.current =
             (NodeBase *)((long)&(i.super_Iterator.current)->next + (ulong)this->maxAllocPageCount);
      }
      local_50 = local_50 + sVar19;
      uVar21 = uVar21 - sVar19;
      pDVar7 = i.super_Iterator.list;
    } while (this->waitingToEnterIdleDecommit != true);
    i.super_Iterator.list = pDVar7;
    cVar20 = this->waitingToEnterIdleDecommit;
    if (uVar21 != 0 && (bool)cVar20 == false) {
      pDVar7 = &this->emptySegments;
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      pDVar5 = (this->emptySegments).
               super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
               .next.base;
      while ((DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
              *)pDVar5 != pDVar7) {
        uVar2 = this->maxAllocPageCount;
        pPVar18 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                  ::Head(pDVar7);
        if (uVar21 < uVar2) {
          sVar19 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::DecommitFreePages
                             (pPVar18,uVar21);
          this->committedBytes = this->committedBytes + sVar19 * -0x1000;
          pPVar3 = this->memoryData;
          if (pPVar3 != (PageMemoryData *)0x0) {
            pPVar3->decommitPageCount = pPVar3->decommitPageCount + sVar19;
            pPVar3->currentCommittedPageCount = pPVar3->currentCommittedPageCount - sVar19;
          }
          if (sVar19 != uVar21) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar13 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                               ,0x85d,"(pageDecommitted == pageToDecommit)",
                               "pageDecommitted == pageToDecommit");
            if (!bVar8) goto LAB_00709683;
            *puVar13 = 0;
          }
          DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
          MoveHeadTo(pDVar7,pDVar15);
          uVar21 = 0;
        }
        else {
          if (pPVar18->decommitPageCount != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar13 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                               ,0x84c,"(emptySegments.Head().GetDecommitPageCount() == 0)",
                               "emptySegments.Head().GetDecommitPageCount() == 0");
            if (!bVar8) goto LAB_00709683;
            *puVar13 = 0;
          }
          pPVar18 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                    ::Head(pDVar7);
          LogFreeSegment(this,&pPVar18->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>);
          DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
          RemoveHead<Memory::NoThrowHeapAllocator>
                    (pDVar7,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance);
          sVar19 = (size_t)this->maxAllocPageCount;
          uVar21 = uVar21 - sVar19;
          i.super_Iterator.current = (NodeBase *)((long)&(i.super_Iterator.current)->next + sVar19);
        }
        local_50 = local_50 + sVar19;
        cVar20 = this->waitingToEnterIdleDecommit;
        if (((bool)cVar20 != false) || (uVar21 == 0)) break;
        pDVar5 = (this->emptySegments).
                 super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                 .next.base;
      }
    }
    pDVar15 = i.super_Iterator.list;
    if (cVar20 == '\0') {
      local_68 = (undefined1  [8])&this->segments;
      i.super_Iterator.list =
           (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
           local_68;
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        if (uVar21 == 0) {
          uVar21 = 0;
          pDVar15 = i.super_Iterator.list;
          break;
        }
        if (i.super_Iterator.list ==
            (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *
            )0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                             ,0x66,"(current != nullptr)","current != nullptr");
          if (!bVar8) goto LAB_00709683;
          *puVar13 = 0;
        }
        i.super_Iterator.list =
             ((i.super_Iterator.list)->
             super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).
             next.list;
        pDVar15 = (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                   *)0x0;
        if ((undefined1  [8])i.super_Iterator.list == local_68) break;
        pPVar18 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                  ::Iterator::Data((Iterator *)local_68);
        sVar19 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::DecommitFreePages
                           (pPVar18,uVar21);
        this->committedBytes = this->committedBytes + sVar19 * -0x1000;
        pPVar3 = this->memoryData;
        if (pPVar3 != (PageMemoryData *)0x0) {
          pPVar3->decommitPageCount = pPVar3->decommitPageCount + sVar19;
          pPVar3->currentCommittedPageCount = pPVar3->currentCommittedPageCount - sVar19;
        }
        pPVar18 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                  ::Iterator::Data((Iterator *)local_68);
        if (pPVar18->decommitPageCount == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x86e,"(i.Data().GetDecommitPageCount() != 0)",
                             "i.Data().GetDecommitPageCount() != 0");
          if (!bVar8) goto LAB_00709683;
          *puVar13 = 0;
        }
        pPVar18 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                  ::Iterator::Data((Iterator *)local_68);
        if (this->maxAllocPageCount < pPVar18->decommitPageCount) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x86f,"(i.Data().GetDecommitPageCount() <= maxAllocPageCount)",
                             "i.Data().GetDecommitPageCount() <= maxAllocPageCount");
          if (!bVar8) goto LAB_00709683;
          *puVar13 = 0;
        }
        pDVar15 = ((i.super_Iterator.list)->
                  super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                  ).prev.list;
        (pDVar15->
        super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).next
             = ((i.super_Iterator.list)->
               super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
               ).next;
        (((i.super_Iterator.list)->
         super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).next
        .base)->prev = ((i.super_Iterator.list)->
                       super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                       ).prev;
        pDVar5 = (this->decommitSegments).
                 super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                 .next.base;
        ((i.super_Iterator.list)->
        super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).prev
             = pDVar5->prev;
        ((i.super_Iterator.list)->
        super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).next.
        base = pDVar5;
        (((pDVar5->prev).base)->next).list = i.super_Iterator.list;
        (pDVar5->prev).list = i.super_Iterator.list;
        ((RealCount *)((long)local_68 + 0x10))->count =
             ((RealCount *)((long)local_68 + 0x10))->count - 1;
        pRVar1 = &(this->decommitSegments).super_RealCount;
        pRVar1->count = pRVar1->count + 1;
        local_50 = local_50 + sVar19;
        uVar21 = uVar21 - sVar19;
        i.super_Iterator.list = pDVar15;
      } while (this->waitingToEnterIdleDecommit != true);
    }
    i.super_Iterator.list = pDVar15;
    if (uVar21 != 0) {
      if (this->waitingToEnterIdleDecommit == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x87b,"(pageToDecommit == 0 || this->waitingToEnterIdleDecommit)",
                           "pageToDecommit == 0 || this->waitingToEnterIdleDecommit");
        if (!bVar8) goto LAB_00709683;
        *puVar13 = 0;
      }
      if (this->waitingToEnterIdleDecommit == true) {
        this->idleDecommitBackOffCount = this->idleDecommitBackOffCount + 1;
      }
    }
    uVar21 = uVar21 + local_40;
    if (this->freePageCount != uVar21 + local_50) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x884,
                         "(this->freePageCount == newFreePageCount + decommitCount + pageToDecommit)"
                         ,"this->freePageCount == newFreePageCount + decommitCount + pageToDecommit"
                        );
      if (!bVar8) {
LAB_00709683:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar13 = 0;
    }
    this->freePageCount = uVar21;
    if (uVar21 < this->debugMinFreePageCount) {
      this->debugMinFreePageCount = uVar21;
    }
    Check(this);
    this->decommitPageCount = this->decommitPageCount + (local_50 - (long)i.super_Iterator.current);
    bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
    if (bVar8) {
      bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
      if (bVar8) {
        Output::Print(L" After decommit now:\n");
        (*this->_vptr_PageAllocatorBase[5])(this);
      }
      Output::Flush();
    }
  }
  return;
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::DecommitNow(bool all)
{
    Assert(!this->HasMultiThreadAccess());

#ifdef ENABLE_BASIC_TELEMETRY
    if (this->decommitStats != nullptr)
    {
        this->decommitStats->numDecommitCalls++;
        if (this->decommitStats->lastLeaveDecommitRegion.ToMicroseconds() > 0)
        {
            Js::TickDelta delta = Js::Tick::Now() - this->decommitStats->lastLeaveDecommitRegion;
            if (delta > this->decommitStats->maxDeltaBetweenDecommitRegionLeaveAndDecommit)
            {
                this->decommitStats->maxDeltaBetweenDecommitRegionLeaveAndDecommit = delta;
            }
        }
    }
#endif

    size_t deleteCount = 0;

#if ENABLE_BACKGROUND_PAGE_ZEROING
    if (CONFIG_FLAG(EnableBGFreeZero))
    {
        // First, drain the zero page queue.
        // This will cause the free page count to be accurate
        if (HasZeroPageQueue())
        {
            int numZeroPagesFreed = 0;

            // There might be queued zero pages.  Drain them first
            bool zeroPageQueueEmpty = false;
            while (true)
            {
                FreePageEntry * freePageEntry = PopPendingZeroPage();
                if (freePageEntry == nullptr)
                {
                    zeroPageQueueEmpty = true;
                    break;
                }

                // Back-off from decommit if we are trying to enter IdleDecommit again.
                if (this->waitingToEnterIdleDecommit)
                {
                    break;
                }

                PAGE_ALLOC_TRACE_AND_STATS_0(_u("Freeing page from zero queue"));
                TPageSegment * segment = freePageEntry->segment;
                uint pageCount = freePageEntry->pageCount;

                numZeroPagesFreed += pageCount;

                DListBase<TPageSegment> * fromSegmentList = GetSegmentList(segment);
                Assert(fromSegmentList != nullptr);

                // Check for all here, since the actual free page count can't be determined
                // until we've flushed the zeroed page queue
                if (all)
                {
                    // Decommit them immediately if we are decommitting all pages.
                    segment->template DecommitPages<false>(freePageEntry, pageCount);
                    LogFreePages(pageCount);
                    LogDecommitPages(pageCount);

                    if (segment->IsAllDecommitted())
                    {
                        LogFreePartiallyDecommittedPageSegment(segment);
                        fromSegmentList->RemoveElement(&NoThrowNoMemProtectHeapAllocator::Instance, segment);

                        deleteCount += maxAllocPageCount;

                        continue;
                    }
                }
                else
                {
                    // Zero them and release them in case we don't decommit them.
                    Assert(this->processHandle == GetCurrentProcess());
                    memset(freePageEntry, 0, pageCount * AutoSystemInfo::PageSize);
                    segment->ReleasePages(freePageEntry, pageCount);
                    LogFreePages(pageCount);
                }

                TransferSegment(segment, fromSegmentList);
            }

            // Take the lock to make sure the recycler thread has finished zeroing out the pages after
            // we drained the queue
            if(zeroPageQueueEmpty)
            {
                AutoCriticalSection autoCS(&backgroundPageQueue->backgroundPageQueueCriticalSection);
                this->hasZeroQueuedPages = false;
                Assert(!this->HasZeroQueuedPages());
            }

            FlushBackgroundPages();
        }
    }
#endif

    if (this->freePageCount == 0)
    {
        Assert(debugMinFreePageCount == 0);
        return;
    }

    PAGE_ALLOC_TRACE_AND_STATS_0(_u("Decommit now"));

    // minFreePageCount is not updated on every page allocate,
    // so we have to do a final update here.
    UpdateMinFreePageCount();

    size_t newFreePageCount;

    if (all)
    {
        newFreePageCount = this->GetFreePageLimit();

        PAGE_ALLOC_TRACE_AND_STATS_0(_u("Full decommit"));
    }
    else
    {
        // Decommit half the min free page count since last partial decommit
        Assert(this->minFreePageCount <= this->freePageCount);
        newFreePageCount = this->freePageCount - (this->minFreePageCount / 2);

        // Ensure we don't decommit down to fewer than our partial decommit minimum
        newFreePageCount = max(newFreePageCount, static_cast<size_t>(MinPartialDecommitFreePageCount));

        PAGE_ALLOC_TRACE_AND_STATS_0(_u("Partial decommit"));
    }

    if (newFreePageCount >= this->freePageCount)
    {
        PAGE_ALLOC_TRACE_AND_STATS_0(_u("No pages to decommit"));
        return;
    }

    size_t pageToDecommit = this->freePageCount - newFreePageCount;

    PAGE_ALLOC_TRACE_AND_STATS(_u("Decommit page count = %d"), pageToDecommit);
    PAGE_ALLOC_TRACE_AND_STATS(_u("Free page count = %d"), this->freePageCount);
    PAGE_ALLOC_TRACE_AND_STATS(_u("New free page count = %d"), newFreePageCount);

    size_t decommitCount = 0;


    // decommit from page that already has other decommitted page already
    {
        typename DListBase<TPageSegment>::EditingIterator i(&decommitSegments);

        while (pageToDecommit > 0  && i.Next())
        {
            size_t pageDecommitted = i.Data().DecommitFreePages(pageToDecommit);
            LogDecommitPages(pageDecommitted);

            decommitCount += pageDecommitted;

            if (i.Data().GetDecommitPageCount() == maxAllocPageCount)
            {
                LogFreePartiallyDecommittedPageSegment(&i.Data());
                i.RemoveCurrent(&NoThrowNoMemProtectHeapAllocator::Instance);

                deleteCount += maxAllocPageCount;

            }
            pageToDecommit -= pageDecommitted;

            // Back-off from decommit if we are trying to enter IdleDecommit again.
            if (this->waitingToEnterIdleDecommit)
            {
                break;
            }
        }
    }

    // decommit pages that are empty.
    // back-off from decommit if we are trying to enter IdleDecommit again.
    while (!this->waitingToEnterIdleDecommit && pageToDecommit > 0 && !emptySegments.Empty())
    {
        if (pageToDecommit >= maxAllocPageCount)
        {
            Assert(emptySegments.Head().GetDecommitPageCount() == 0);
            LogFreeSegment(&emptySegments.Head());
            emptySegments.RemoveHead(&NoThrowNoMemProtectHeapAllocator::Instance);

            pageToDecommit -= maxAllocPageCount;

            decommitCount += maxAllocPageCount;
            deleteCount += maxAllocPageCount;

        }
        else
        {
            size_t pageDecommitted = emptySegments.Head().DecommitFreePages(pageToDecommit);
            LogDecommitPages(pageDecommitted);

            decommitCount += pageDecommitted;

            Assert(pageDecommitted == pageToDecommit);
            emptySegments.MoveHeadTo(&decommitSegments);
            pageToDecommit = 0;
        }
    }

    if(!this->waitingToEnterIdleDecommit)
    {
        typename DListBase<TPageSegment>::EditingIterator i(&segments);

        while (pageToDecommit > 0  && i.Next())
        {
            size_t pageDecommitted = i.Data().DecommitFreePages(pageToDecommit);
            LogDecommitPages(pageDecommitted);

            decommitCount += pageDecommitted;

            Assert(i.Data().GetDecommitPageCount() != 0);
            Assert(i.Data().GetDecommitPageCount() <= maxAllocPageCount);
            i.MoveCurrentTo(&decommitSegments);
            pageToDecommit -= pageDecommitted;

            // Back-off from decommit if we are trying to enter IdleDecommit again.
            if (this->waitingToEnterIdleDecommit)
            {
                break;
            }
        }
    }

    Assert(pageToDecommit == 0 || this->waitingToEnterIdleDecommit);
#if DBG
    if (pageToDecommit != 0 && this->waitingToEnterIdleDecommit)
    {
        this->idleDecommitBackOffCount++;
    }
#endif

#if DBG_DUMP
    Assert(this->freePageCount == newFreePageCount + decommitCount + pageToDecommit);
#endif

    // If we had to back-off from decommiting then we may still have some free pages left to decommit.
    this->freePageCount = newFreePageCount + pageToDecommit;

#ifdef ENABLE_BASIC_TELEMETRY
    if (this->decommitStats != nullptr)
    {
        this->decommitStats->numPagesDecommitted += decommitCount;
        this->decommitStats->numFreePageCount += newFreePageCount + pageToDecommit;
    }
#endif

#if DBG
    UpdateMinimum(this->debugMinFreePageCount, this->freePageCount);
    Check();
#endif
#if DBG_DUMP
    this->decommitPageCount += (decommitCount - deleteCount);
    if (CUSTOM_PHASE_TRACE1(this->pageAllocatorFlagTable, Js::PageAllocatorPhase))
    {
        if (CUSTOM_PHASE_STATS1(this->pageAllocatorFlagTable, Js::PageAllocatorPhase))
        {
            Output::Print(_u(" After decommit now:\n"));
            this->DumpStats();
        }
        Output::Flush();
    }
#endif
}